

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void diy::Serialization<std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>_>::load
               (BinaryBuffer *bb,Vector *v)

{
  size_t __new_size;
  size_t s;
  Bounds<int> local_a0;
  
  (**(code **)(*(long *)bb + 0x20))(bb,&s,8);
  __new_size = s;
  Bounds<int>::Bounds(&local_a0);
  std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>::resize(v,__new_size,&local_a0);
  Bounds<int>::~Bounds(&local_a0);
  if (s != 0) {
    load<diy::Bounds<int>>
              (bb,(v->super__Vector_base<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start,s);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }